

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O1

bool __thiscall
r_comp::RepliStruct::parseDirective
          (RepliStruct *this,istream *stream,uint64_t *curIndent,uint64_t *prevIndent)

{
  istream iVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  bool bVar7;
  int64_t iVar8;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  uint64_t *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"!","");
  while ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
         (cVar2 = std::istream::peek(), ' ' < cVar2))) {
    std::istream::get();
    std::__cxx11::string::push_back((char)&local_98);
  }
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_98);
    local_58 = curIndent;
    if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_98), iVar3 == 0)) {
      iVar8 = 2;
LAB_0011fb6b:
      bVar7 = false;
LAB_0011fb92:
      std::__cxx11::string::_M_assign((string *)&this->cmd);
      if (bVar7) {
        while ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
               (iVar3 = std::istream::peek(), 0xd < iVar3))) {
          std::istream::get();
        }
        bVar7 = true;
        iVar1 = stream[*(long *)(*(long *)stream + -0x18) + 0x20];
        while ((((byte)iVar1 & 2) == 0 && (iVar3 = std::istream::peek(), iVar3 < 0x20))) {
          iVar3 = std::istream::get();
          if (iVar3 == 10) {
            GlobalLine = GlobalLine + 1;
          }
          iVar1 = stream[*(long *)(*(long *)stream + -0x18) + 0x20];
        }
        goto LAB_0011fb3e;
      }
      iVar8 = parse(this,stream,local_58,prevIndent,iVar8);
      if (iVar8 == 0) {
        bVar7 = true;
        goto LAB_0011fb3e;
      }
      std::operator+(&local_50,"Error parsing the arguments for directive \'",&this->cmd);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_78 = &local_68;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_68 = *plVar4;
        lStack_60 = puVar5[3];
      }
      else {
        local_68 = *plVar4;
        local_78 = (long *)*puVar5;
      }
      local_70 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->error,(ulong)local_78);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar3 == 0) {
        iVar8 = 1;
        goto LAB_0011fb6b;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_98);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_98), iVar3 == 0)) {
        iVar8 = 1;
        bVar7 = false;
LAB_0011fb89:
        this->type = Condition;
        goto LAB_0011fb92;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_98);
      bVar7 = true;
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_98), iVar3 == 0)) {
        iVar8 = 0;
        goto LAB_0011fb89;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_98);
      if ((((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_98), iVar3 == 0))
          || (iVar3 = std::__cxx11::string::compare((char *)&local_98), iVar3 == 0)) ||
         (iVar3 = std::__cxx11::string::compare((char *)&local_98), iVar3 == 0)) {
        iVar8 = 1;
        goto LAB_0011fb6b;
      }
      std::operator+(&local_50,"Unknown directive: \'",&local_98);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_78 = &local_68;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_68 = *plVar6;
        lStack_60 = plVar4[3];
      }
      else {
        local_68 = *plVar6;
        local_78 = (long *)*plVar4;
      }
      local_70 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->error,(ulong)local_78);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::append((char *)&this->error);
  }
  bVar7 = false;
LAB_0011fb3e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return bVar7;
}

Assistant:

bool RepliStruct::parseDirective(std::istream *stream, uint64_t &curIndent, uint64_t &prevIndent)
{
    std::string str = "!";
    // RepliStruct* subStruct;
    char c;

    // We know that parent read a '!', so first find out which directive
    while ((!stream->eof()) && ((c = stream->peek()) > 32)) {
        str += stream->get();
    }

    if (stream->eof()) {
        error += "Error in directive formatting, end of file reached unexpectedly. ";
        return false;
    }

    unsigned int paramCount = 0;

    if (str.compare("!def") == 0) { // () ()
        paramCount = 2;
    } else if (str.compare("!counter") == 0) { // xxx val
        paramCount = 2;
    } else if (str.compare("!undef") == 0) { // xxx
        paramCount = 1;
    } else if (str.compare("!ifdef") == 0) { // name
        this->type = Condition;
        paramCount = 1;
    } else if (str.compare("!ifundef") == 0) { // name
        this->type = Condition;
        paramCount = 1;
    } else if (str.compare("!else") == 0) { //
        this->type = Condition;
        paramCount = 0;
    } else if (str.compare("!endif") == 0) { //
        this->type = Condition;
        paramCount = 0;
    } else if (str.compare("!class") == 0) { // ()
        paramCount = 1;
    } else if (str.compare("!op") == 0) { // ():xxx
        paramCount = 1;
    } else if (str.compare("!dfn") == 0) { // ()
        paramCount = 1;
    } else if (str.compare("!load") == 0) { // xxx
        paramCount = 1;
    } else {
        error += "Unknown directive: '" + str + "'. ";
        return false;
    }

    cmd = str;

    if (paramCount == 0) {
        // read until end of line, including any comments
        while ((!stream->eof()) && (stream->peek() > 13)) {
            stream->get();
        }

        // read the end of line too
        while ((!stream->eof()) && (stream->peek() < 32))
            if (stream->get() == '\n') {
                GlobalLine++;
            }

        return true;
    }

    if (parse(stream, curIndent, prevIndent, paramCount) != 0) {
        error += "Error parsing the arguments for directive '" + cmd + "'. ";
        return false;
    } else {
        return true;
    }
}